

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quark.c
# Opt level: O3

void qrk_load(qrk_t *qrk,FILE *file)

{
  int iVar1;
  uint64_t cnt;
  
  iVar1 = __isoc99_fscanf(file,"#qrk#%lu\n");
  if (iVar1 != 1) {
    iVar1 = ferror((FILE *)file);
    if (iVar1 != 0) {
      pfatal("cannot read from file");
    }
    pfatal("invalid format");
  }
  return;
}

Assistant:

void qrk_load(qrk_t *qrk, FILE *file) {
	uint64_t cnt = 0;
	if (fscanf(file, "#qrk#%"SCNu64"\n", &cnt) != 1) {
		if (ferror(file) != 0)
			pfatal("cannot read from file");
		pfatal("invalid format");
	}
	for (uint64_t n = 0; n < cnt; ++n) {
		char *str = ns_readstr(file);
		qrk_str2id(qrk, str);
		free(str);
	}
}